

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<chrono::geometry::ChTriangle>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>_>
          *bVal)

{
  vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_> *pvVar1;
  pointer pCVar2;
  pointer pCVar3;
  long lVar4;
  pointer pCVar5;
  ulong uVar6;
  size_t arraysize;
  ChFunctorArchiveInSpecific<chrono::geometry::ChTriangle> specFuncA;
  ChTriangle element;
  char idname [20];
  size_type local_c8;
  undefined **local_c0;
  ChTriangle *local_b8;
  char *local_b0;
  undefined ***local_a8;
  undefined1 local_a0;
  ChTriangle local_98;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  pCVar2 = (pvVar1->
           super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (pvVar1->
           super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pCVar5 = pCVar2;
  if (pCVar3 != pCVar2) {
    do {
      (**(pCVar5->super_ChGeometry)._vptr_ChGeometry)(pCVar5);
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != pCVar3);
    (pvVar1->
    super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_c8);
  std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>::resize
            (bVal->_value,local_c8);
  if (local_c8 != 0) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      sprintf(local_48,"%lu",uVar6);
      local_98.super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b66468;
      local_98.p1.m_data[0] = VNULL;
      local_98.p1.m_data[1] = DAT_00b90ac0;
      local_98.p1.m_data[2] = DAT_00b90ac8;
      local_98.p2.m_data[0] = VNULL;
      local_98.p2.m_data[1] = DAT_00b90ac0;
      local_98.p2.m_data[2] = DAT_00b90ac8;
      local_98.p3.m_data[0] = VNULL;
      local_98.p3.m_data[1] = DAT_00b90ac0;
      local_98.p3.m_data[2] = DAT_00b90ac8;
      local_c0 = &PTR__ChFunctorArchiveIn_00b66950;
      local_a8 = &local_c0;
      local_a0 = 0;
      local_b8 = &local_98;
      local_b0 = local_48;
      (**(code **)(*(long *)this + 0x60))(this,&local_b0);
      geometry::ChTriangle::operator=
                ((ChTriangle *)
                 ((long)(((bVal->_value->
                          super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                          )._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar4 + -8),
                 &local_98);
      (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x50;
    } while (uVar6 < local_c8);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }